

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void __thiscall ftxui::MenuBase::~MenuBase(MenuBase *this)

{
  MenuBase *this_local;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__MenuBase_00219528;
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::~vector(&this->boxes_);
  Ref<ftxui::MenuOption>::~Ref(&this->option_);
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

MenuBase(ConstStringListRef entries, int* selected, Ref<MenuOption> option)
      : entries_(entries), selected_(selected), option_(option) {}